

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON_writer.hh
# Opt level: O0

Writer * __thiscall JSON::Writer::writeBase64(Writer *this,string_view sv)

{
  const_pointer pvVar1;
  void *__buf;
  size_t __n;
  undefined1 local_a0 [8];
  Pl_Base64 base;
  Pl_Concatenate cat;
  Writer *this_local;
  string_view sv_local;
  
  sv_local._M_len = (size_t)sv._M_str;
  this_local = (Writer *)sv._M_len;
  Pl_Concatenate::Pl_Concatenate((Pl_Concatenate *)&base.end_of_data,"writer concat",this->p);
  __n = 0;
  Pl_Base64::Pl_Base64((Pl_Base64 *)local_a0,"writer base64",(Pipeline *)&base.end_of_data,a_encode)
  ;
  pvVar1 = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  __buf = (void *)std::basic_string_view<char,_std::char_traits<char>_>::size
                            ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  Pl_Base64::write((Pl_Base64 *)local_a0,(int)pvVar1,__buf,__n);
  Pl_Base64::finish((Pl_Base64 *)local_a0);
  Pl_Base64::~Pl_Base64((Pl_Base64 *)local_a0);
  Pl_Concatenate::~Pl_Concatenate((Pl_Concatenate *)&base.end_of_data);
  return this;
}

Assistant:

Writer&
    writeBase64(std::string_view sv)
    {
        Pl_Concatenate cat{"writer concat", p};
        Pl_Base64 base{"writer base64", &cat, Pl_Base64::a_encode};
        base.write(reinterpret_cast<unsigned char const*>(sv.data()), sv.size());
        base.finish();
        return *this;
    }